

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_thread_create(nng_thread **thrp,_func_void_void_ptr *func,void *arg)

{
  nni_thr *thr_00;
  int rv;
  nni_thr *thr;
  void *arg_local;
  _func_void_void_ptr *func_local;
  nng_thread **thrp_local;
  
  thr_00 = (nni_thr *)nni_zalloc(0x98);
  if (thr_00 == (nni_thr *)0x0) {
    thrp_local._4_4_ = 2;
  }
  else {
    *thrp = (nng_thread *)thr_00;
    thrp_local._4_4_ = nni_thr_init(thr_00,func,arg);
    if (thrp_local._4_4_ == 0) {
      nni_thr_run(thr_00);
      thrp_local._4_4_ = 0;
    }
  }
  return thrp_local._4_4_;
}

Assistant:

int
nng_thread_create(nng_thread **thrp, void (*func)(void *), void *arg)
{
	nni_thr *thr;
	int      rv;

	if ((thr = NNI_ALLOC_STRUCT(thr)) == NULL) {
		return (NNG_ENOMEM);
	}
	*thrp = (void *) thr;
	if ((rv = nni_thr_init(thr, func, arg)) != 0) {
		return (rv);
	}
	nni_thr_run(thr);
	return (0);
}